

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexUtil.cpp
# Opt level: O0

vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
vkt::pipeline::createOverlappingQuads(void)

{
  Vector<float,_2> *this;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *in_RDI;
  float fVar1;
  float fVar2;
  undefined1 local_120 [8];
  Vertex4RGBA upperRightVertex;
  Vertex4RGBA lowerRightVertex;
  Vertex4RGBA upperLeftVertex;
  Vertex4RGBA lowerLeftVertex;
  Vec4 *color;
  Vec2 *translation;
  int quadNdx;
  float quadSize;
  Vec4 quadColors [4];
  Vector<float,_2> local_38;
  Vec2 translations [4];
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *vertices;
  
  translations[3].m_data[1]._3_1_ = 0;
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::vector
            (in_RDI);
  tcu::Vector<float,_2>::Vector(&local_38,-0.25,-0.25);
  tcu::Vector<float,_2>::Vector(translations,-1.0,-0.25);
  tcu::Vector<float,_2>::Vector(translations + 1,-1.0,-1.0);
  tcu::Vector<float,_2>::Vector(translations + 2,-0.25,-1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&quadNdx,1.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(quadColors[0].m_data + 2),0.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(quadColors[1].m_data + 2),0.0,0.0,1.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(quadColors[2].m_data + 2),1.0,0.0,1.0,1.0);
  for (translation._0_4_ = 0; (int)translation < 4; translation._0_4_ = (int)translation + 1) {
    this = translations + (long)(int)translation + -1;
    lowerLeftVertex.color.m_data._8_8_ = &quadNdx + (long)(int)translation * 4;
    fVar1 = tcu::Vector<float,_2>::x(this);
    fVar2 = tcu::Vector<float,_2>::y(this);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(upperLeftVertex.color.m_data + 2),fVar1,fVar2,0.0,1.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(lowerLeftVertex.position.m_data + 2),
               (Vector<float,_4> *)lowerLeftVertex.color.m_data._8_8_);
    fVar1 = tcu::Vector<float,_2>::x(this);
    fVar2 = tcu::Vector<float,_2>::y(this);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(lowerRightVertex.color.m_data + 2),fVar1,fVar2 + 1.25,0.0,1.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(upperLeftVertex.position.m_data + 2),
               (Vector<float,_4> *)lowerLeftVertex.color.m_data._8_8_);
    fVar1 = tcu::Vector<float,_2>::x(this);
    fVar2 = tcu::Vector<float,_2>::y(this);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(upperRightVertex.color.m_data + 2),fVar1 + 1.25,fVar2,0.0,1.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(lowerRightVertex.position.m_data + 2),
               (Vector<float,_4> *)lowerLeftVertex.color.m_data._8_8_);
    fVar1 = tcu::Vector<float,_2>::x(this);
    fVar2 = tcu::Vector<float,_2>::y(this);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_120,fVar1 + 1.25,fVar2 + 1.25,0.0,1.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)(upperRightVertex.position.m_data + 2),
               (Vector<float,_4> *)lowerLeftVertex.color.m_data._8_8_);
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (in_RDI,(value_type *)(upperLeftVertex.color.m_data + 2));
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (in_RDI,(value_type *)(upperRightVertex.color.m_data + 2));
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (in_RDI,(value_type *)(lowerRightVertex.color.m_data + 2));
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (in_RDI,(value_type *)(upperRightVertex.color.m_data + 2));
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (in_RDI,(value_type *)(lowerRightVertex.color.m_data + 2));
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::push_back
              (in_RDI,(value_type *)local_120);
  }
  return in_RDI;
}

Assistant:

std::vector<Vertex4RGBA> createOverlappingQuads (void)
{
	using tcu::Vec2;
	using tcu::Vec4;

	std::vector<Vertex4RGBA> vertices;

	const Vec2 translations[4] =
	{
		Vec2(-0.25f, -0.25f),
		Vec2(-1.0f, -0.25f),
		Vec2(-1.0f, -1.0f),
		Vec2(-0.25f, -1.0f)
	};

	const Vec4 quadColors[4] =
	{
		Vec4(1.0f, 0.0f, 0.0f, 1.0),
		Vec4(0.0f, 1.0f, 0.0f, 1.0),
		Vec4(0.0f, 0.0f, 1.0f, 1.0),
		Vec4(1.0f, 0.0f, 1.0f, 1.0)
	};

	const float quadSize = 1.25f;

	for (int quadNdx = 0; quadNdx < 4; quadNdx++)
	{
		const Vec2&	translation	= translations[quadNdx];
		const Vec4&	color		= quadColors[quadNdx];

		const Vertex4RGBA lowerLeftVertex =
		{
			Vec4(translation.x(), translation.y(), 0.0f, 1.0f),
			color
		};
		const Vertex4RGBA upperLeftVertex =
		{
			Vec4(translation.x(), translation.y() + quadSize, 0.0f, 1.0f),
			color
		};
		const Vertex4RGBA lowerRightVertex =
		{
			Vec4(translation.x() + quadSize, translation.y(), 0.0f, 1.0f),
			color
		};
		const Vertex4RGBA upperRightVertex =
		{
			Vec4(translation.x() + quadSize, translation.y() + quadSize, 0.0f, 1.0f),
			color
		};

		// Triangle 1, CCW
		vertices.push_back(lowerLeftVertex);
		vertices.push_back(lowerRightVertex);
		vertices.push_back(upperLeftVertex);

		// Triangle 2, CW
		vertices.push_back(lowerRightVertex);
		vertices.push_back(upperLeftVertex);
		vertices.push_back(upperRightVertex);
	}

	return vertices;
}